

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapedLatticePentRod.cpp
# Opt level: O2

void __thiscall
OpenMD::shapedLatticePentRod::shapedLatticePentRod
          (shapedLatticePentRod *this,RealType latticeConstant,string *latticeType,RealType radius,
          RealType length)

{
  Vector3d origin;
  Vector3d dimension;
  string local_98;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  Vector<double,_3U> local_28;
  
  std::__cxx11::string::string((string *)&local_98,(string *)latticeType);
  shapedLattice::shapedLattice(&this->super_shapedLattice,latticeConstant,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  (this->super_shapedLattice)._vptr_shapedLattice = (_func_int **)&PTR__shapedLattice_002c0d28;
  this->rodRadius_ = radius;
  this->rodLength_ = length;
  Vector<double,_3U>::Vector(&local_28);
  local_28.data_[0] = length + length;
  local_28.data_[1] = local_28.data_[0];
  local_28.data_[2] = local_28.data_[0];
  Vector<double,_3U>::Vector(&local_60,&local_28);
  shapedLattice::setGridDimension(&this->super_shapedLattice,(Vector3d *)&local_60);
  Vector<double,_3U>::Vector(&local_48);
  local_48.data_[0] = 0.0;
  local_48.data_[1] = 0.0;
  local_48.data_[2] = 2.04;
  Vector<double,_3U>::Vector(&local_78,&local_48);
  shapedLattice::setOrigin(&this->super_shapedLattice,(Vector3d *)&local_78);
  return;
}

Assistant:

shapedLatticePentRod::shapedLatticePentRod(RealType latticeConstant,
                                             std::string latticeType,
                                             RealType radius, RealType length) :
      shapedLattice(latticeConstant, latticeType) {
    rodRadius_ = radius;
    rodLength_ = length;
    Vector3d dimension;
    dimension[0] = 2.0 * length;
    dimension[1] = 2.0 * length;
    dimension[2] = 2.0 * length;
    setGridDimension(dimension);
    Vector3d origin;
    origin[0] = 0;
    origin[1] = 0;
    origin[2] = 2.04;
    setOrigin(origin);
  }